

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnviewgrip.cpp
# Opt level: O2

int __thiscall QColumnViewGrip::moveGrip(QColumnViewGrip *this,int offset)

{
  int iVar1;
  QWidget *this_00;
  bool bVar2;
  int iVar3;
  QSize QVar4;
  Representation w;
  int iVar5;
  int iVar6;
  
  this_00 = *(QWidget **)(*(long *)(this + 8) + 0x10);
  iVar6 = (this_00->data->crect).x2.m_i - (this_00->data->crect).x1.m_i;
  bVar2 = QWidget::isRightToLeft((QWidget *)this);
  iVar5 = -offset;
  if (!bVar2) {
    iVar5 = offset;
  }
  w.m_i = iVar5 + iVar6 + 1;
  QVar4 = QWidget::minimumSize(this_00);
  if (w.m_i <= QVar4.wd.m_i.m_i) {
    w.m_i = QVar4.wd.m_i.m_i;
  }
  QWidget::resize(this_00,w.m_i,((this_00->data->crect).y2.m_i - (this_00->data->crect).y1.m_i) + 1)
  ;
  iVar5 = (this_00->data->crect).x2.m_i;
  iVar1 = (this_00->data->crect).x1.m_i;
  iVar3 = QWidget::x(this_00);
  iVar5 = (iVar5 - (iVar6 + 1 + iVar1)) + 1;
  if (iVar5 != 0) {
    gripMoved(this,iVar5);
  }
  bVar2 = QWidget::isRightToLeft((QWidget *)this);
  if (bVar2) {
    iVar5 = QWidget::x(this_00);
    iVar5 = iVar5 - iVar3;
  }
  return iVar5;
}

Assistant:

int QColumnViewGrip::moveGrip(int offset)
{
    QWidget *parentWidget = (QWidget*)parent();

    // first resize the parent
    int oldWidth = parentWidget->width();
    int newWidth = oldWidth;
    if (isRightToLeft())
       newWidth -= offset;
    else
       newWidth += offset;
    newWidth = qMax(parentWidget->minimumWidth(), newWidth);
    parentWidget->resize(newWidth, parentWidget->height());

    // Then have the view move the widget
    int realOffset = parentWidget->width() - oldWidth;
    int oldX = parentWidget->x();
    if (realOffset != 0)
        emit gripMoved(realOffset);
    if (isRightToLeft())
        realOffset = -1 * (oldX - parentWidget->x());
    return realOffset;
}